

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O3

string_t duckdb::TernaryLambdaWrapper::
         Operation<duckdb::RegexReplaceFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__1,duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                   (anon_class_16_2_50904408 fun,string_t a,string_t b,string_t c,ValidityMask *mask
                   ,idx_t idx)

{
  InvalidInputException *this;
  long lVar1;
  anon_union_16_2_67f50693_for_value aVar2;
  RE2 re;
  undefined8 local_128;
  char *pcStack_120;
  string local_110;
  undefined8 local_f0;
  long local_e8;
  StringPiece local_e0;
  undefined8 local_d0;
  pointer local_c8;
  RE2 local_c0;
  
  local_c8 = b.value._8_8_;
  local_d0 = b.value._0_8_;
  local_128 = c.value._0_8_;
  pcStack_120 = c.value.pointer.ptr;
  local_110._M_dataplus._M_p = local_c8;
  if (b.value._0_4_ < 0xd) {
    local_110._M_dataplus._M_p = (pointer)((long)&local_d0 + 4);
  }
  local_110._M_string_length = (size_type)b.value._0_4_;
  local_f0 = a.value._0_8_;
  local_e8 = a.value._8_8_;
  duckdb_re2::RE2::RE2
            (&local_c0,(StringPiece *)&local_110,&((fun.info)->super_RegexpBaseBindData).options);
  if ((local_c0._68_4_ & 0x1fffffff) == 0) {
    lVar1 = a.value._8_8_;
    if (a.value._0_4_ < 0xd) {
      lVar1 = (long)&local_f0 + 4;
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,lVar1,(a.value._0_8_ & 0xffffffff) + lVar1);
    local_e0.data_ = (char *)((long)&local_128 + 4);
    if (((fun.info)->super_RegexpBaseBindData).field_0x41 == '\x01') {
      local_e0.size_ = local_128 & 0xffffffff;
      if (0xc < local_e0.size_) {
        local_e0.data_ = pcStack_120;
      }
      duckdb_re2::RE2::GlobalReplace(&local_110,&local_c0,&local_e0);
    }
    else {
      local_e0.size_ = local_128 & 0xffffffff;
      if (0xc < local_e0.size_) {
        local_e0.data_ = pcStack_120;
      }
      duckdb_re2::RE2::Replace(&local_110,&local_c0,&local_e0);
    }
    aVar2.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)StringVector::AddString(fun.result,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    duckdb_re2::RE2::~RE2(&local_c0);
    return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar2.pointer;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  InvalidInputException::InvalidInputException(this,(string *)local_c0.error_);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline RESULT_TYPE Operation(FUN fun, A_TYPE a, B_TYPE b, C_TYPE c, ValidityMask &mask, idx_t idx) {
		return fun(a, b, c);
	}